

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

Integer GAsizeof(Integer type)

{
  if (type - 0x3e9U < 0x10) {
    return *(Integer *)("\tcurrent total bytes\t\t%10lu\t%10lu\n" + type * 8 + 0xc);
  }
  return 0;
}

Assistant:

Integer GAsizeof(Integer type)    
{
  switch (type) {
     case C_DBL  : return (sizeof(double));
     case C_INT  : return (sizeof(int));
     case C_SCPL : return (sizeof(SingleComplex));
     case C_DCPL : return (sizeof(DoubleComplex));
     case C_FLOAT : return (sizeof(float));
     case C_LONG : return (sizeof(long));
     case C_LONGLONG : return (sizeof(long long));
     case F_DBL : return (sizeof(DoublePrecision));
     case F_INT  : return (sizeof(Integer));
          default   : return 0; 
  }
}